

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O0

void phmap::priv::(anonymous_namespace)::
     DoTest<phmap::priv::(anonymous_namespace)::multi_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>,int>
               (char *param_1,
               multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
               *b,vector<int,_std::allocator<int>_> *values)

{
  undefined1 auVar1 [8];
  int iVar2;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar3;
  ulong uVar4;
  bool bVar5;
  size_type sVar6;
  const_reference pvVar7;
  unsigned_long *puVar8;
  int *piVar9;
  reference piVar10;
  EVP_PKEY_CTX *pEVar11;
  btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
  *siglen;
  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
  siglen_00;
  int *piVar12;
  size_type sVar13;
  unsigned_long *puVar14;
  uchar *sig;
  uchar *sig_01;
  uchar *sig_02;
  uchar *sig_03;
  uchar *sig_04;
  uchar *sig_05;
  uchar *sig_06;
  uchar *sig_07;
  char *pcVar15;
  size_t in_R9;
  iterator iVar16;
  iterator iVar17;
  const_iterator cVar18;
  const_iterator cVar19;
  iterator iVar20;
  btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_const_int_&,_const_int_*>
  b_00;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
  b_01;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
  b_02;
  iterator iter;
  iterator begin;
  iterator begin_00;
  iterator begin_01;
  btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_const_int_&,_const_int_*>
  e;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
  e_00;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
  e_01;
  iterator end;
  iterator end_00;
  iterator end_01;
  AssertHelper local_778;
  Message local_770;
  unsigned_long local_768;
  size_type local_760;
  undefined1 local_758 [8];
  AssertionResult gtest_ar_16;
  ulong local_728;
  size_t i_12;
  size_t i_11;
  AssertHelper local_6f8;
  Message local_6f0;
  ulong local_6e8;
  size_type local_6e0;
  undefined1 local_6d8 [8];
  AssertionResult gtest_ar_15;
  ulong local_690;
  size_t i_10;
  undefined1 auStack_678 [8];
  iterator mutable_iter_begin;
  Message local_660;
  unsigned_long local_658;
  size_type local_650;
  undefined1 local_648 [8];
  AssertionResult gtest_ar_14;
  ulong local_608;
  size_t i_9;
  undefined1 auStack_5f0 [8];
  iterator mutable_iter_end;
  Message local_5d8;
  int local_5cc;
  size_type local_5c8;
  undefined1 local_5c0 [8];
  AssertionResult gtest_ar_13;
  ulong local_540;
  size_t i_8;
  Message local_530;
  int local_524;
  size_type local_520;
  undefined1 local_518 [8];
  AssertionResult gtest_ar_12;
  ulong local_4d8;
  size_t i_7;
  Message local_4c8;
  int local_4bc;
  size_type local_4b8;
  undefined1 local_4b0 [8];
  AssertionResult gtest_ar_11;
  Message local_498;
  undefined4 local_490;
  int local_48c;
  undefined1 local_488 [8];
  AssertionResult gtest_ar_10;
  size_t i_6;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
  local_460;
  ulong local_450;
  size_t i_5;
  Message local_440;
  size_type local_438;
  size_type local_430;
  undefined1 local_428 [8];
  AssertionResult gtest_ar_9;
  Message local_410;
  int local_404;
  size_type local_400;
  undefined1 local_3f8 [8];
  AssertionResult gtest_ar_8;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
  local_3d8;
  ulong local_3c8;
  size_t i_4;
  Message local_3b8;
  size_type local_3b0;
  size_type local_3a8;
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar_7;
  Message local_388;
  int local_37c;
  size_type local_378;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_6;
  Message local_358;
  size_type local_350;
  size_type local_348;
  undefined1 local_340 [8];
  AssertionResult gtest_ar_5;
  Message local_328;
  size_type local_320;
  size_type local_318;
  undefined1 local_310 [8];
  AssertionResult gtest_ar_4;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
  local_2f0;
  ulong local_2e0;
  size_t i_3;
  Message local_2d0;
  size_type local_2c8;
  size_type local_2c0;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_3;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
  local_218;
  ulong local_208;
  size_t i_2;
  Message local_1f8;
  size_type local_1f0;
  size_type local_1e8;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_2;
  undefined1 local_190 [8];
  multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
  b_range;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
  local_130;
  ulong local_120;
  size_t i_1;
  Message local_110;
  size_type local_108;
  size_type local_100;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_1;
  multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
  b_copy;
  AssertHelper local_90 [3];
  Message local_78;
  size_type local_70;
  size_type local_68;
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  ulong local_40;
  size_t i;
  multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
  *const_b;
  multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
  *mutable_b;
  vector<int,_std::allocator<int>_> *pvStack_20;
  type key_of_value;
  vector<int,_std::allocator<int>_> *values_local;
  multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
  *b_local;
  char *param_0_local;
  uchar *sig_00;
  uchar *tbs;
  
  pvStack_20 = values;
  for (local_40 = 0; sVar6 = std::vector<int,_std::allocator<int>_>::size(pvStack_20),
      local_40 < sVar6; local_40 = local_40 + 1) {
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvStack_20,local_40);
    iVar16 = anon_unknown_0::
             multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
             ::insert(b,pvVar7);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )iVar16.node;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvStack_20,local_40);
    base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
    ::value_check(&b->
                   super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                  ,pvVar7);
  }
  local_68 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
             ::size(&b->
                     super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                   );
  local_70 = std::vector<int,_std::allocator<int>_>::size(pvStack_20);
  pcVar15 = "mutable_b.size()";
  puVar14 = &local_68;
  puVar8 = &local_70;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_60,"mutable_b.size()","values.size()",puVar14,puVar8);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar5) {
    testing::Message::Message(&local_78);
    puVar8 = (unsigned_long *)testing::AssertionResult::failure_message((AssertionResult *)local_60)
    ;
    puVar14 = (unsigned_long *)0x1b0;
    testing::internal::AssertHelper::AssertHelper
              (local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x1b0,(char *)puVar8);
    pcVar15 = (char *)&local_78;
    testing::internal::AssertHelper::operator=(local_90,(Message *)pcVar15);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  if (bVar5) {
    base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
    ::verify(&b->
              super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
             ,(EVP_PKEY_CTX *)pcVar15,sig,(size_t)puVar14,(uchar *)puVar8,in_R9);
    anon_unknown_0::
    multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
    ::multi_checker((multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                     *)&gtest_ar_1.message_,b);
    local_100 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                ::size((base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                        *)&gtest_ar_1.message_);
    local_108 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                ::size(&b->
                        super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                      );
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((EqHelper *)local_f8,"b_copy.size()","const_b.size()",&local_100,&local_108);
    bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
    if (!bVar5) {
      testing::Message::Message(&local_110);
      pcVar15 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&i_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x1b6,pcVar15);
      testing::internal::AssertHelper::operator=((AssertHelper *)&i_1,&local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i_1);
      testing::Message::~Message(&local_110);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
    for (local_120 = 0; uVar4 = local_120,
        sVar6 = std::vector<int,_std::allocator<int>_>::size(pvStack_20), uVar4 < sVar6;
        local_120 = local_120 + 1) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvStack_20,local_120);
      piVar9 = KeyOfValue<int,_int>::type::operator()((type *)((long)&mutable_b + 7),pvVar7);
      iVar17 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
               ::find((base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                       *)&gtest_ar_1.message_,piVar9);
      b_range.
      super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
      .checker_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)iVar17.node;
      local_130.position = iVar17.position;
      local_130.node =
           (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
            *)b_range.
              super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
              .checker_._M_t._M_impl.super__Rb_tree_header._M_node_count;
      piVar10 = btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
                ::operator*(&local_130);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvStack_20,local_120);
      CheckPairEquals<int,int>(piVar10,pvVar7);
    }
    cVar18 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
             ::begin(&b->
                      super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                    );
    cVar19 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
             ::end(&b->
                    super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                  );
    gtest_ar_2.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )cVar19.node;
    b_00._12_4_ = 0;
    b_00.node = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                 *)SUB128(cVar18._0_12_,0);
    b_00.position = SUB124(cVar18._0_12_,8);
    e._12_4_ = 0;
    e.node = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
              *)SUB128(cVar19._0_12_,0);
    e.position = SUB124(cVar19._0_12_,8);
    multi_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>
    ::
    multi_checker<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>const,int_const&,int_const*>>
              ((multi_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>
                *)local_190,b_00,e);
    local_1e8 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                ::size((base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                        *)local_190);
    local_1f0 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                ::size(&b->
                        super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                      );
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((EqHelper *)local_1e0,"b_range.size()","const_b.size()",&local_1e8,&local_1f0);
    bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
    if (!bVar5) {
      testing::Message::Message(&local_1f8);
      pcVar15 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&i_2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x1bd,pcVar15);
      testing::internal::AssertHelper::operator=((AssertHelper *)&i_2,&local_1f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i_2);
      testing::Message::~Message(&local_1f8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
    for (local_208 = 0; uVar4 = local_208,
        sVar6 = std::vector<int,_std::allocator<int>_>::size(pvStack_20), uVar4 < sVar6;
        local_208 = local_208 + 1) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvStack_20,local_208);
      piVar9 = KeyOfValue<int,_int>::type::operator()((type *)((long)&mutable_b + 7),pvVar7);
      iVar17 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
               ::find((base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                       *)local_190,piVar9);
      local_218.node = iVar17.node;
      local_218.position = iVar17.position;
      piVar10 = btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
                ::operator*(&local_218);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvStack_20,local_208);
      CheckPairEquals<int,int>(piVar10,pvVar7);
    }
    iVar17 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
             ::begin((base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                      *)&gtest_ar_1.message_);
    pEVar11 = (EVP_PKEY_CTX *)iVar17.node;
    iVar20 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
             ::end((base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                    *)&gtest_ar_1.message_);
    siglen = iVar20.node;
    b_01._12_4_ = 0;
    b_01.node = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                 *)SUB128(iVar17._0_12_,0);
    b_01.position = SUB124(iVar17._0_12_,8);
    e_00._12_4_ = 0;
    e_00.node = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                 *)SUB128(iVar20._0_12_,0);
    e_00.position = SUB124(iVar20._0_12_,8);
    tbs = (uchar *)(ulong)(uint)iVar20.position;
    multi_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>
    ::
    insert<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>,int&,int*>>
              ((multi_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>
                *)local_190,b_01,e_00);
    base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
    ::verify((base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
              *)local_190,pEVar11,sig_00,(size_t)siglen,tbs,in_R9);
    base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
    ::clear((base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
             *)local_190);
    iVar17 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
             ::begin((base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                      *)&gtest_ar_1.message_);
    iVar20 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
             ::end((base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                    *)&gtest_ar_1.message_);
    gtest_ar_3.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )iVar20.node;
    b_02._12_4_ = 0;
    b_02.node = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                 *)SUB128(iVar17._0_12_,0);
    b_02.position = SUB124(iVar17._0_12_,8);
    e_01._12_4_ = 0;
    e_01.node = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                 *)SUB128(iVar20._0_12_,0);
    e_01.position = SUB124(iVar20._0_12_,8);
    multi_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>
    ::
    insert<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>,int&,int*>>
              ((multi_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>
                *)local_190,b_02,e_01);
    local_2c0 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                ::size((base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                        *)local_190);
    local_2c8 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                ::size((base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                        *)&gtest_ar_1.message_);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((EqHelper *)local_2b8,"b_range.size()","b_copy.size()",&local_2c0,&local_2c8);
    bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
    if (!bVar5) {
      testing::Message::Message(&local_2d0);
      pcVar15 = testing::AssertionResult::failure_message((AssertionResult *)local_2b8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&i_3,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x1c9,pcVar15);
      testing::internal::AssertHelper::operator=((AssertHelper *)&i_3,&local_2d0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i_3);
      testing::Message::~Message(&local_2d0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
    for (local_2e0 = 0; uVar4 = local_2e0,
        sVar6 = std::vector<int,_std::allocator<int>_>::size(pvStack_20), uVar4 < sVar6;
        local_2e0 = local_2e0 + 1) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvStack_20,local_2e0);
      piVar9 = KeyOfValue<int,_int>::type::operator()((type *)((long)&mutable_b + 7),pvVar7);
      iVar17 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
               ::find((base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                       *)local_190,piVar9);
      gtest_ar_4.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )iVar17.node;
      local_2f0.position = iVar17.position;
      local_2f0.node =
           (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
            *)gtest_ar_4.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl;
      piVar10 = btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
                ::operator*(&local_2f0);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvStack_20,local_2e0);
      CheckPairEquals<int,int>(piVar10,pvVar7);
    }
    anon_unknown_0::
    multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
    ::operator=((multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                 *)local_190,
                (multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                 *)local_190);
    local_318 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                ::size((base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                        *)local_190);
    local_320 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                ::size((base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                        *)&gtest_ar_1.message_);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((EqHelper *)local_310,"b_range.size()","b_copy.size()",&local_318,&local_320);
    bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
    if (!bVar5) {
      testing::Message::Message(&local_328);
      pcVar15 = testing::AssertionResult::failure_message((AssertionResult *)local_310);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x1d0,pcVar15);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_328);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
      testing::Message::~Message(&local_328);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
    base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
    ::clear((base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
             *)local_190);
    anon_unknown_0::
    multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
    ::operator=((multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                 *)local_190,
                (multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                 *)&gtest_ar_1.message_);
    local_348 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                ::size((base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                        *)local_190);
    local_350 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                ::size((base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                        *)&gtest_ar_1.message_);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((EqHelper *)local_340,"b_range.size()","b_copy.size()",&local_348,&local_350);
    bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
    if (!bVar5) {
      testing::Message::Message(&local_358);
      pcVar15 = testing::AssertionResult::failure_message((AssertionResult *)local_340);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x1d5,pcVar15);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_358);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
      testing::Message::~Message(&local_358);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
    base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
    ::clear((base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
             *)local_190);
    base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
    ::swap((base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
            *)local_190,
           (base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
            *)&gtest_ar_1.message_);
    local_378 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                ::size((base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                        *)&gtest_ar_1.message_);
    local_37c = 0;
    testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
              ((EqHelper *)local_370,"b_copy.size()","0",&local_378,&local_37c);
    bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
    if (!bVar5) {
      testing::Message::Message(&local_388);
      pcVar15 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x1da,pcVar15);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_388);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
      testing::Message::~Message(&local_388);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
    local_3a8 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                ::size((base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                        *)local_190);
    local_3b0 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                ::size(&b->
                        super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                      );
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((EqHelper *)local_3a0,"b_range.size()","const_b.size()",&local_3a8,&local_3b0);
    bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a0);
    if (!bVar5) {
      testing::Message::Message(&local_3b8);
      pcVar15 = testing::AssertionResult::failure_message((AssertionResult *)local_3a0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&i_4,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x1db,pcVar15);
      testing::internal::AssertHelper::operator=((AssertHelper *)&i_4,&local_3b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i_4);
      testing::Message::~Message(&local_3b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
    for (local_3c8 = 0; uVar4 = local_3c8,
        sVar6 = std::vector<int,_std::allocator<int>_>::size(pvStack_20), uVar4 < sVar6;
        local_3c8 = local_3c8 + 1) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvStack_20,local_3c8);
      piVar9 = KeyOfValue<int,_int>::type::operator()((type *)((long)&mutable_b + 7),pvVar7);
      iVar17 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
               ::find((base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                       *)local_190,piVar9);
      gtest_ar_8.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )iVar17.node;
      local_3d8.position = iVar17.position;
      local_3d8.node =
           (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
            *)gtest_ar_8.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl;
      piVar10 = btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
                ::operator*(&local_3d8);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvStack_20,local_3c8);
      CheckPairEquals<int,int>(piVar10,pvVar7);
    }
    base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
    ::swap((base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
            *)local_190,
           (base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
            *)&gtest_ar_1.message_);
    std::
    swap<phmap::priv::(anonymous_namespace)::multi_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>>
              ((multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                *)local_190,
               (multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                *)&gtest_ar_1.message_);
    local_400 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                ::size((base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                        *)&gtest_ar_1.message_);
    local_404 = 0;
    testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
              ((EqHelper *)local_3f8,"b_copy.size()","0",&local_400,&local_404);
    bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f8);
    if (!bVar5) {
      testing::Message::Message(&local_410);
      pcVar15 = testing::AssertionResult::failure_message((AssertionResult *)local_3f8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x1e3,pcVar15);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_410);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
      testing::Message::~Message(&local_410);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f8);
    local_430 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                ::size((base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                        *)local_190);
    local_438 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                ::size(&b->
                        super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                      );
    puVar14 = &local_438;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((EqHelper *)local_428,"b_range.size()","const_b.size()",&local_430,puVar14);
    bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_428);
    if (!bVar5) {
      testing::Message::Message(&local_440);
      puVar14 = (unsigned_long *)
                testing::AssertionResult::failure_message((AssertionResult *)local_428);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&i_5,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x1e4,(char *)puVar14);
      testing::internal::AssertHelper::operator=((AssertHelper *)&i_5,&local_440);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i_5);
      testing::Message::~Message(&local_440);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_428);
    for (local_450 = 0; uVar4 = local_450,
        sVar6 = std::vector<int,_std::allocator<int>_>::size(pvStack_20), uVar4 < sVar6;
        local_450 = local_450 + 1) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvStack_20,local_450);
      piVar9 = KeyOfValue<int,_int>::type::operator()((type *)((long)&mutable_b + 7),pvVar7);
      iVar17 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
               ::find((base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                       *)local_190,piVar9);
      local_460.node = iVar17.node;
      local_460.position = iVar17.position;
      piVar10 = btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
                ::operator*(&local_460);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvStack_20,local_450);
      CheckPairEquals<int,int>(piVar10,pvVar7);
    }
    pcVar15 = (char *)&gtest_ar_1.message_;
    std::
    swap<phmap::priv::(anonymous_namespace)::multi_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>>
              ((multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                *)local_190,
               (multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                *)pcVar15);
    for (gtest_ar_10.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl =
              (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
               )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0;
        uVar3._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             gtest_ar_10.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,
        siglen_00.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )std::vector<int,_std::allocator<int>_>::size(pvStack_20),
        (ulong)uVar3._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl <
        (ulong)siglen_00.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
        gtest_ar_10.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )((long)gtest_ar_10.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl + 1)) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         (pvStack_20,
                          (size_type)
                          gtest_ar_10.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl);
      piVar9 = KeyOfValue<int,_int>::type::operator()((type *)((long)&mutable_b + 7),pvVar7);
      base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
      ::erase(&b->
               super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
              ,piVar9);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         (pvStack_20,
                          (size_type)
                          gtest_ar_10.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl);
      piVar9 = KeyOfValue<int,_int>::type::operator()((type *)((long)&mutable_b + 7),pvVar7);
      local_48c = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                  ::erase(&b->
                           super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                          ,piVar9);
      local_490 = 0;
      pcVar15 = "mutable_b.erase(key_of_value(values[i]))";
      puVar14 = (unsigned_long *)&local_490;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_488,"mutable_b.erase(key_of_value(values[i]))","0",&local_48c,
                 (int *)puVar14);
      bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
      if (!bVar5) {
        testing::Message::Message(&local_498);
        puVar14 = (unsigned_long *)
                  testing::AssertionResult::failure_message((AssertionResult *)local_488);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_11.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x1ee,(char *)puVar14);
        pcVar15 = (char *)&local_498;
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_11.message_,(Message *)pcVar15);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
        testing::Message::~Message(&local_498);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
      if (!bVar5) goto LAB_001979c0;
    }
    base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
    ::verify(&b->
              super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
             ,(EVP_PKEY_CTX *)pcVar15,sig_01,
             (size_t)siglen_00.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,(uchar *)puVar14,in_R9);
    local_4b8 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                ::size(&b->
                        super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                      );
    local_4bc = 0;
    piVar9 = &local_4bc;
    testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
              ((EqHelper *)local_4b0,"const_b.size()","0",&local_4b8,piVar9);
    bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b0);
    if (!bVar5) {
      testing::Message::Message(&local_4c8);
      piVar9 = (int *)testing::AssertionResult::failure_message((AssertionResult *)local_4b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&i_7,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x1f2,(char *)piVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&i_7,&local_4c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i_7);
      testing::Message::~Message(&local_4c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b0);
    pEVar11 = (EVP_PKEY_CTX *)&gtest_ar_1.message_;
    anon_unknown_0::
    multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
    ::operator=(b,(multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                   *)pEVar11);
    for (local_4d8 = 0; sVar6 = std::vector<int,_std::allocator<int>_>::size(pvStack_20),
        local_4d8 < sVar6; local_4d8 = local_4d8 + 1) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvStack_20,local_4d8);
      piVar12 = KeyOfValue<int,_int>::type::operator()((type *)((long)&mutable_b + 7),pvVar7);
      iVar17 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
               ::find(&b->
                       super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                      ,piVar12);
      pEVar11 = (EVP_PKEY_CTX *)iVar17.node;
      iter._12_4_ = 0;
      iter.node = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                   *)SUB128(iVar17._0_12_,0);
      iter.position = SUB124(iVar17._0_12_,8);
      iVar17 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
               ::erase(&b->
                        super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                       ,iter);
      gtest_ar_12.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )iVar17.node;
    }
    base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
    ::verify(&b->
              super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
             ,pEVar11,sig_02,sVar6,(uchar *)piVar9,in_R9);
    local_520 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                ::size(&b->
                        super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                      );
    local_524 = 0;
    pcVar15 = "const_b.size()";
    piVar9 = &local_524;
    testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
              ((EqHelper *)local_518,"const_b.size()","0",&local_520,piVar9);
    bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_518);
    if (!bVar5) {
      testing::Message::Message(&local_530);
      piVar9 = (int *)testing::AssertionResult::failure_message((AssertionResult *)local_518);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&i_8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x1fb,(char *)piVar9);
      pcVar15 = (char *)&local_530;
      testing::internal::AssertHelper::operator=((AssertHelper *)&i_8,(Message *)pcVar15);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i_8);
      testing::Message::~Message(&local_530);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_518);
    for (local_540 = 0; sVar6 = std::vector<int,_std::allocator<int>_>::size(pvStack_20),
        local_540 < sVar6; local_540 = local_540 + 1) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvStack_20,local_540);
      piVar12 = KeyOfValue<int,_int>::type::operator()((type *)((long)&mutable_b + 7),pvVar7);
      iVar17 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
               ::upper_bound(&b->
                              super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                             ,piVar12);
      pcVar15 = (char *)iVar17.node;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvStack_20,local_540);
      iVar16._12_4_ = 0;
      iVar16.node = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                     *)SUB128(iVar17._0_12_,0);
      iVar16.position = SUB124(iVar17._0_12_,8);
      anon_unknown_0::
      multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
      ::insert(b,iVar16,pvVar7);
    }
    base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
    ::verify(&b->
              super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
             ,(EVP_PKEY_CTX *)pcVar15,sig_03,sVar6,(uchar *)piVar9,in_R9);
    iVar17 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
             ::begin(&b->
                      super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                    );
    iVar20 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
             ::end(&b->
                    super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                  );
    gtest_ar_13.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )iVar20.node;
    begin._12_4_ = 0;
    begin.node = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                  *)SUB128(iVar17._0_12_,0);
    begin.position = SUB124(iVar17._0_12_,8);
    iVar17._12_4_ = 0;
    iVar17.node = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                   *)SUB128(iVar20._0_12_,0);
    iVar17.position = SUB124(iVar20._0_12_,8);
    base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
    ::erase(&b->
             super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
            ,begin,iVar17);
    local_5c8 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                ::size(&b->
                        super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                      );
    local_5cc = 0;
    pcVar15 = "mutable_b.size()";
    puVar14 = &local_5c8;
    piVar9 = &local_5cc;
    testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
              ((EqHelper *)local_5c0,"mutable_b.size()","0",puVar14,piVar9);
    bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c0);
    if (!bVar5) {
      testing::Message::Message(&local_5d8);
      piVar9 = (int *)testing::AssertionResult::failure_message((AssertionResult *)local_5c0);
      puVar14 = (unsigned_long *)0x206;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&mutable_iter_end.position,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x206,(char *)piVar9);
      pcVar15 = (char *)&local_5d8;
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&mutable_iter_end.position,(Message *)pcVar15);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mutable_iter_end.position);
      testing::Message::~Message(&local_5d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c0);
    base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
    ::verify(&b->
              super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
             ,(EVP_PKEY_CTX *)pcVar15,sig_04,(size_t)puVar14,(uchar *)piVar9,in_R9);
    anon_unknown_0::
    multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
    ::operator=(b,(multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                   *)&gtest_ar_1.message_);
    iVar17 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
             ::begin(&b->
                      super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                    );
    auStack_5f0 = (undefined1  [8])iVar17.node;
    mutable_iter_end.node._0_4_ = iVar17.position;
    for (local_608 = 0; sVar6 = std::vector<int,_std::allocator<int>_>::size(pvStack_20),
        local_608 < sVar6 >> 1; local_608 = local_608 + 1) {
      btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
      ::operator++((btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
                    *)auStack_5f0);
    }
    iVar17 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
             ::begin(&b->
                      super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                    );
    gtest_ar_14.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )auStack_5f0;
    end.position = (int)mutable_iter_end.node;
    end.node = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                *)auStack_5f0;
    iVar20._12_4_ = 0;
    iVar20.node = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                   *)SUB128(iVar17._0_12_,0);
    iVar20.position = SUB124(iVar17._0_12_,8);
    end._12_4_ = 0;
    base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
    ::erase(&b->
             super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
            ,iVar20,end);
    local_650 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                ::size(&b->
                        super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                      );
    sVar6 = std::vector<int,_std::allocator<int>_>::size(pvStack_20);
    sVar13 = std::vector<int,_std::allocator<int>_>::size(pvStack_20);
    local_658 = sVar6 - (sVar13 >> 1);
    pcVar15 = "mutable_b.size()";
    puVar14 = &local_650;
    puVar8 = &local_658;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((EqHelper *)local_648,"mutable_b.size()","values.size() - values.size() / 2",puVar14,
               puVar8);
    bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_648);
    if (!bVar5) {
      testing::Message::Message(&local_660);
      puVar8 = (unsigned_long *)
               testing::AssertionResult::failure_message((AssertionResult *)local_648);
      puVar14 = (unsigned_long *)0x20e;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&mutable_iter_begin.position,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x20e,(char *)puVar8);
      pcVar15 = (char *)&local_660;
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&mutable_iter_begin.position,(Message *)pcVar15);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mutable_iter_begin.position);
      testing::Message::~Message(&local_660);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_648);
    base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
    ::verify(&b->
              super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
             ,(EVP_PKEY_CTX *)pcVar15,sig_05,(size_t)puVar14,(uchar *)puVar8,in_R9);
    anon_unknown_0::
    multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
    ::operator=(b,(multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                   *)&gtest_ar_1.message_);
    iVar17 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
             ::begin(&b->
                      super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                    );
    auStack_678 = (undefined1  [8])iVar17.node;
    mutable_iter_begin.node._0_4_ = iVar17.position;
    for (local_690 = 0; sVar6 = std::vector<int,_std::allocator<int>_>::size(pvStack_20),
        iVar2 = (int)mutable_iter_begin.node, auVar1 = auStack_678, local_690 < sVar6 >> 1;
        local_690 = local_690 + 1) {
      btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
      ::operator++((btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
                    *)auStack_678);
    }
    iVar17 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
             ::end(&b->
                    super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                  );
    gtest_ar_15.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )iVar17.node;
    begin_00.position = iVar2;
    begin_00.node =
         (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
          *)auVar1;
    begin_00._12_4_ = 0;
    end_00._12_4_ = 0;
    end_00.node = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                   *)SUB128(iVar17._0_12_,0);
    end_00.position = SUB124(iVar17._0_12_,8);
    base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
    ::erase(&b->
             super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
            ,begin_00,end_00);
    local_6e0 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                ::size(&b->
                        super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                      );
    sVar6 = std::vector<int,_std::allocator<int>_>::size(pvStack_20);
    local_6e8 = sVar6 >> 1;
    pcVar15 = "mutable_b.size()";
    puVar14 = &local_6e0;
    puVar8 = &local_6e8;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((EqHelper *)local_6d8,"mutable_b.size()","values.size() / 2",puVar14,puVar8);
    bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6d8);
    if (!bVar5) {
      testing::Message::Message(&local_6f0);
      puVar8 = (unsigned_long *)
               testing::AssertionResult::failure_message((AssertionResult *)local_6d8);
      puVar14 = (unsigned_long *)0x216;
      testing::internal::AssertHelper::AssertHelper
                (&local_6f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x216,(char *)puVar8);
      pcVar15 = (char *)&local_6f0;
      testing::internal::AssertHelper::operator=(&local_6f8,(Message *)pcVar15);
      testing::internal::AssertHelper::~AssertHelper(&local_6f8);
      testing::Message::~Message(&local_6f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_6d8);
    base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
    ::verify(&b->
              super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
             ,(EVP_PKEY_CTX *)pcVar15,sig_06,(size_t)puVar14,(uchar *)puVar8,in_R9);
    anon_unknown_0::
    multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
    ::operator=(b,(multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                   *)&gtest_ar_1.message_);
    iVar17 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
             ::begin(&b->
                      super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                    );
    auStack_678 = (undefined1  [8])iVar17.node;
    mutable_iter_begin.node._0_4_ = iVar17.position;
    for (i_12 = 0; sVar6 = std::vector<int,_std::allocator<int>_>::size(pvStack_20),
        i_12 < sVar6 >> 2; i_12 = i_12 + 1) {
      btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
      ::operator++((btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
                    *)auStack_678);
    }
    auStack_5f0 = auStack_678;
    mutable_iter_end.node._0_4_ = (int)mutable_iter_begin.node;
    for (local_728 = 0; sVar6 = std::vector<int,_std::allocator<int>_>::size(pvStack_20),
        local_728 < sVar6 >> 2; local_728 = local_728 + 1) {
      btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
      ::operator++((btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
                    *)auStack_5f0);
    }
    gtest_ar_16.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )auStack_5f0;
    begin_01.position = (int)mutable_iter_begin.node;
    begin_01.node =
         (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
          *)auStack_678;
    end_01.position = (int)mutable_iter_end.node;
    end_01.node = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                   *)auStack_5f0;
    begin_01._12_4_ = 0;
    end_01._12_4_ = 0;
    base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
    ::erase(&b->
             super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
            ,begin_01,end_01);
    local_760 = base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                ::size(&b->
                        super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                      );
    sVar6 = std::vector<int,_std::allocator<int>_>::size(pvStack_20);
    sVar13 = std::vector<int,_std::allocator<int>_>::size(pvStack_20);
    local_768 = sVar6 - (sVar13 >> 2);
    pcVar15 = "mutable_b.size()";
    puVar14 = &local_760;
    puVar8 = &local_768;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((EqHelper *)local_758,"mutable_b.size()","values.size() - values.size() / 4",puVar14,
               puVar8);
    bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_758);
    if (!bVar5) {
      testing::Message::Message(&local_770);
      puVar8 = (unsigned_long *)
               testing::AssertionResult::failure_message((AssertionResult *)local_758);
      puVar14 = (unsigned_long *)0x220;
      testing::internal::AssertHelper::AssertHelper
                (&local_778,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x220,(char *)puVar8);
      pcVar15 = (char *)&local_770;
      testing::internal::AssertHelper::operator=(&local_778,(Message *)pcVar15);
      testing::internal::AssertHelper::~AssertHelper(&local_778);
      testing::Message::~Message(&local_770);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_758);
    base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
    ::verify(&b->
              super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
             ,(EVP_PKEY_CTX *)pcVar15,sig_07,(size_t)puVar14,(uchar *)puVar8,in_R9);
    base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
    ::clear(&b->
             super_base_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
           );
LAB_001979c0:
    anon_unknown_0::
    multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
    ::~multi_checker((multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                      *)local_190);
    anon_unknown_0::
    multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
    ::~multi_checker((multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                      *)&gtest_ar_1.message_);
  }
  return;
}

Assistant:

void DoTest(const char *, T *b, const std::vector<V> &values) {
        typename KeyOfValue<typename T::key_type, V>::type key_of_value;

        T &mutable_b = *b;
        const T &const_b = *b;

        // Test insert.
        for (size_t i = 0; i < values.size(); ++i) {
            mutable_b.insert(values[i]);
            mutable_b.value_check(values[i]);
        }
        ASSERT_EQ(mutable_b.size(), values.size());

        const_b.verify();

        // Test copy constructor.
        T b_copy(const_b);
        EXPECT_EQ(b_copy.size(), const_b.size());
        for (size_t i = 0; i < values.size(); ++i) {
            CheckPairEquals(*b_copy.find(key_of_value(values[i])), values[i]);
        }

        // Test range constructor.
        T b_range(const_b.begin(), const_b.end());
        EXPECT_EQ(b_range.size(), const_b.size());
        for (size_t i = 0; i < values.size(); ++i) {
            CheckPairEquals(*b_range.find(key_of_value(values[i])), values[i]);
        }

        // Test range insertion for values that already exist.
        b_range.insert(b_copy.begin(), b_copy.end());
        b_range.verify();

        // Test range insertion for new values.
        b_range.clear();
        b_range.insert(b_copy.begin(), b_copy.end());
        EXPECT_EQ(b_range.size(), b_copy.size());
        for (size_t i = 0; i < values.size(); ++i) {
            CheckPairEquals(*b_range.find(key_of_value(values[i])), values[i]);
        }

        // Test assignment to self. Nothing should change.
        b_range.operator=(b_range);
        EXPECT_EQ(b_range.size(), b_copy.size());

        // Test assignment of new values.
        b_range.clear();
        b_range = b_copy;
        EXPECT_EQ(b_range.size(), b_copy.size());

        // Test swap.
        b_range.clear();
        b_range.swap(b_copy);
        EXPECT_EQ(b_copy.size(), 0);
        EXPECT_EQ(b_range.size(), const_b.size());
        for (size_t i = 0; i < values.size(); ++i) {
            CheckPairEquals(*b_range.find(key_of_value(values[i])), values[i]);
        }
        b_range.swap(b_copy);

        // Test non-member function swap.
        swap(b_range, b_copy);
        EXPECT_EQ(b_copy.size(), 0);
        EXPECT_EQ(b_range.size(), const_b.size());
        for (size_t i = 0; i < values.size(); ++i) {
            CheckPairEquals(*b_range.find(key_of_value(values[i])), values[i]);
        }
        swap(b_range, b_copy);

        // Test erase via values.
        for (size_t i = 0; i < values.size(); ++i) {
            mutable_b.erase(key_of_value(values[i]));
            // Erasing a non-existent key should have no effect.
            ASSERT_EQ(mutable_b.erase(key_of_value(values[i])), 0);
        }

        const_b.verify();
        EXPECT_EQ(const_b.size(), 0);

        // Test erase via iterators.
        mutable_b = b_copy;
        for (size_t i = 0; i < values.size(); ++i) {
            mutable_b.erase(mutable_b.find(key_of_value(values[i])));
        }

        const_b.verify();
        EXPECT_EQ(const_b.size(), 0);

        // Test insert with hint.
        for (size_t i = 0; i < values.size(); i++) {
            mutable_b.insert(mutable_b.upper_bound(key_of_value(values[i])), values[i]);
        }

        const_b.verify();

        // Test range erase.
        mutable_b.erase(mutable_b.begin(), mutable_b.end());
        EXPECT_EQ(mutable_b.size(), 0);
        const_b.verify();

        // First half.
        mutable_b = b_copy;
        typename T::iterator mutable_iter_end = mutable_b.begin();
        for (size_t i = 0; i < values.size() / 2; ++i) ++mutable_iter_end;
        mutable_b.erase(mutable_b.begin(), mutable_iter_end);
        EXPECT_EQ(mutable_b.size(), values.size() - values.size() / 2);
        const_b.verify();

        // Second half.
        mutable_b = b_copy;
        typename T::iterator mutable_iter_begin = mutable_b.begin();
        for (size_t i = 0; i < values.size() / 2; ++i) ++mutable_iter_begin;
        mutable_b.erase(mutable_iter_begin, mutable_b.end());
        EXPECT_EQ(mutable_b.size(), values.size() / 2);
        const_b.verify();

        // Second quarter.
        mutable_b = b_copy;
        mutable_iter_begin = mutable_b.begin();
        for (size_t i = 0; i < values.size() / 4; ++i) ++mutable_iter_begin;
        mutable_iter_end = mutable_iter_begin;
        for (size_t i = 0; i < values.size() / 4; ++i) ++mutable_iter_end;
        mutable_b.erase(mutable_iter_begin, mutable_iter_end);
        EXPECT_EQ(mutable_b.size(), values.size() - values.size() / 4);
        const_b.verify();

        mutable_b.clear();
    }